

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_image *
rf_gen_image_perlin_noise_to_buffer
          (rf_image *__return_storage_ptr__,int width,int height,int offset_x,int offset_y,
          float scale,rf_color *dst,rf_int dst_size)

{
  uchar uVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  long local_80;
  
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  if (width * height * 4 <= dst_size) {
    if (0 < height) {
      local_80 = 0;
      do {
        if (0 < width) {
          lVar3 = local_80 * width;
          lVar12 = 0;
          do {
            fVar16 = 1.0;
            iVar14 = 0;
            fVar20 = 0.0;
            fVar23 = 1.0;
            do {
              fVar28 = (((float)(offset_x + lVar12) * scale) / (float)width) * fVar16;
              fVar25 = (((float)(offset_y + local_80) * scale) / (float)height) * fVar16;
              uVar15 = (int)fVar28 - (uint)(fVar28 < (float)(int)fVar28);
              uVar6 = (int)fVar25 - (uint)(fVar25 < (float)(int)fVar25);
              uVar2 = (int)fVar16 - (uint)(fVar16 < (float)(int)fVar16);
              uVar13 = (ulong)(uVar6 + 1 & 0xff);
              uVar4 = (ulong)(uVar2 & 0xff);
              uVar11 = (ulong)(uVar2 + 1 & 0xff);
              fVar28 = fVar28 - (float)(int)uVar15;
              fVar25 = fVar25 - (float)(int)uVar6;
              fVar19 = fVar16 - (float)(int)uVar2;
              lVar5 = (ulong)"\a\t\x05"
                             [uVar4 + stb__perlin_randtab
                                      [(ulong)(uVar6 & 0xff) +
                                       (ulong)stb__perlin_randtab[(uVar15 & 0xff) + iVar14]]] * 0x10
              ;
              fVar27 = fVar19 + -1.0;
              lVar7 = (ulong)"\a\t\x05"
                             [stb__perlin_randtab
                              [(ulong)(uVar6 & 0xff) +
                               (ulong)stb__perlin_randtab[(uVar15 & 0xff) + iVar14]] + uVar11] *
                      0x10;
              fVar22 = fVar25 + -1.0;
              lVar8 = (ulong)"\a\t\x05"
                             [uVar4 + stb__perlin_randtab
                                      [stb__perlin_randtab[(uVar15 & 0xff) + iVar14] + uVar13]] *
                      0x10;
              lVar9 = (ulong)"\a\t\x05"
                             [stb__perlin_randtab
                              [stb__perlin_randtab[(uVar15 & 0xff) + iVar14] + uVar13] + uVar11] *
                      0x10;
              fVar18 = *(float *)(stb__perlin_grad_basis + lVar5 + 8) * fVar19 +
                       *(float *)(stb__perlin_grad_basis + lVar5) * fVar28 +
                       *(float *)(stb__perlin_grad_basis + lVar5 + 4) * fVar25;
              fVar17 = ((fVar25 * 6.0 + -15.0) * fVar25 + 10.0) * fVar25 * fVar25 * fVar25;
              fVar29 = fVar28 + -1.0;
              lVar5 = (ulong)"\a\t\x05"
                             [uVar4 + stb__perlin_randtab
                                      [(ulong)(uVar6 & 0xff) +
                                       (ulong)stb__perlin_randtab[(uVar15 + 1 & 0xff) + iVar14]]] *
                      0x10;
              fVar21 = *(float *)(stb__perlin_grad_basis + lVar8 + 8) * fVar19 +
                       *(float *)(stb__perlin_grad_basis + lVar8) * fVar28 +
                       *(float *)(stb__perlin_grad_basis + lVar8 + 4) * fVar22;
              lVar8 = (ulong)"\a\t\x05"
                             [stb__perlin_randtab
                              [(ulong)(uVar6 & 0xff) +
                               (ulong)stb__perlin_randtab[(uVar15 + 1 & 0xff) + iVar14]] + uVar11] *
                      0x10;
              fVar24 = *(float *)(stb__perlin_grad_basis + lVar5 + 8) * fVar19 +
                       *(float *)(stb__perlin_grad_basis + lVar5) * fVar29 +
                       *(float *)(stb__perlin_grad_basis + lVar5 + 4) * fVar25;
              lVar5 = (ulong)"\a\t\x05"
                             [uVar4 + stb__perlin_randtab
                                      [uVar13 + stb__perlin_randtab[(uVar15 + 1 & 0xff) + iVar14]]]
                      * 0x10;
              lVar10 = (ulong)"\a\t\x05"
                              [uVar11 + stb__perlin_randtab
                                        [uVar13 + stb__perlin_randtab[(uVar15 + 1 & 0xff) + iVar14]]
                              ] * 0x10;
              fVar26 = ((fVar19 * 6.0 + -15.0) * fVar19 + 10.0) * fVar19 * fVar19 * fVar19;
              fVar19 = fVar19 * *(float *)(stb__perlin_grad_basis + lVar5 + 8) +
                       *(float *)(stb__perlin_grad_basis + lVar5) * fVar29 +
                       *(float *)(stb__perlin_grad_basis + lVar5 + 4) * fVar22;
              fVar18 = ((*(float *)(stb__perlin_grad_basis + lVar7 + 8) * fVar27 +
                        *(float *)(stb__perlin_grad_basis + lVar7) * fVar28 +
                        *(float *)(stb__perlin_grad_basis + lVar7 + 4) * fVar25) - fVar18) * fVar26
                       + fVar18;
              fVar24 = ((*(float *)(stb__perlin_grad_basis + lVar8 + 8) * fVar27 +
                        *(float *)(stb__perlin_grad_basis + lVar8) * fVar29 +
                        fVar25 * *(float *)(stb__perlin_grad_basis + lVar8 + 4)) - fVar24) * fVar26
                       + fVar24;
              fVar18 = ((((*(float *)(stb__perlin_grad_basis + lVar9 + 8) * fVar27 +
                          *(float *)(stb__perlin_grad_basis + lVar9) * fVar28 +
                          *(float *)(stb__perlin_grad_basis + lVar9 + 4) * fVar22) - fVar21) *
                         fVar26 + fVar21) - fVar18) * fVar17 + fVar18;
              fVar20 = fVar20 + (((((((fVar27 * *(float *)(stb__perlin_grad_basis + lVar10 + 8) +
                                      fVar29 * *(float *)(stb__perlin_grad_basis + lVar10) +
                                      fVar22 * *(float *)(stb__perlin_grad_basis + lVar10 + 4)) -
                                     fVar19) * fVar26 + fVar19) - fVar24) * fVar17 + fVar24) -
                                 fVar18) * ((fVar28 * 6.0 + -15.0) * fVar28 + 10.0) * fVar28 *
                                           fVar28 * fVar28 + fVar18) * fVar23;
              fVar16 = fVar16 + fVar16;
              fVar23 = fVar23 * 0.5;
              iVar14 = iVar14 + 1;
            } while (iVar14 != 6);
            uVar1 = (uchar)(int)((fVar20 + 1.0) * 0.5 * 255.0);
            dst[lVar3 + lVar12].r = uVar1;
            dst[lVar3 + lVar12].g = uVar1;
            dst[lVar3 + lVar12].b = uVar1;
            dst[lVar3 + lVar12].a = 0xff;
            lVar12 = lVar12 + 1;
          } while (lVar12 != width);
        }
        local_80 = local_80 + 1;
      } while (local_80 != height);
    }
    __return_storage_ptr__->data = dst;
    __return_storage_ptr__->width = width;
    __return_storage_ptr__->height = height;
    __return_storage_ptr__->format = RF_UNCOMPRESSED_R8G8B8A8;
    __return_storage_ptr__->valid = true;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_perlin_noise_to_buffer(int width, int height, int offset_x, int offset_y, float scale, rf_color* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (dst_size >= width * height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8))
    {
        for (rf_int y = 0; y < height; y++)
        {
            for (rf_int x = 0; x < width; x++)
            {
                float nx = (float)(x + offset_x)*scale/(float)width;
                float ny = (float)(y + offset_y)*scale/(float)height;

                // Typical values to start playing with:
                //   lacunarity = ~2.0   -- spacing between successive octaves (use exactly 2.0 for wrapping output)
                //   gain       =  0.5   -- relative weighting applied to each successive octave
                //   octaves    =  6     -- number of "octaves" of noise3() to sum

                // NOTE: We need to translate the data from [-1..1] to [0..1]
                float p = (stb_perlin_fbm_noise3(nx, ny, 1.0f, 2.0f, 0.5f, 6) + 1.0f) / 2.0f;

                int intensity = (int)(p * 255.0f);
                dst[y * width + x] = (rf_color){ intensity, intensity, intensity, 255 };
            }
        }

        result = (rf_image)
        {
            .data = dst,
            .width = width,
            .height = height,
            .format = RF_UNCOMPRESSED_R8G8B8A8,
            .valid = true,
        };
    }

    return result;
}